

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxInfeas(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  int iVar11;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar12;
  pointer pnVar13;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar14;
  long lVar15;
  cpp_dec_float<100U,_int,_void> *pcVar16;
  cpp_dec_float<100U,_int,_void> *pcVar17;
  pointer pnVar18;
  long lVar19;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,0.0);
  if (this->theType == ENTER) {
    if ((this->m_pricingViolUpToDate != false) && (this->m_pricingViolCoUpToDate == true)) {
      pnVar1 = &this->m_pricingViol;
      pnVar2 = &this->m_pricingViolCo;
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 0x10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems[6] = 0;
      local_d8.data._M_elems[7] = 0;
      local_d8.data._M_elems[8] = 0;
      local_d8.data._M_elems[9] = 0;
      local_d8.data._M_elems[10] = 0;
      local_d8.data._M_elems[0xb] = 0;
      local_d8.data._M_elems[0xc] = 0;
      local_d8.data._M_elems[0xd] = 0;
      local_d8.data._M_elems._56_5_ = 0;
      local_d8.data._M_elems[0xf]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      pcVar17 = &pnVar1->m_backend;
      if ((&local_d8 != &pnVar2->m_backend) &&
         (pcVar17 = &pnVar2->m_backend, &local_d8 != &pnVar1->m_backend)) {
        local_d8.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        local_d8.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 2);
        local_d8.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 4);
        local_d8.data._M_elems._24_8_ =
             *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 6);
        local_d8.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 8);
        local_d8.data._M_elems._40_8_ =
             *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 10);
        local_d8.data._M_elems._48_8_ =
             *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 0xc);
        uVar3 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 0xe);
        local_d8.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_d8.exp = (this->m_pricingViol).m_backend.exp;
        local_d8.neg = (this->m_pricingViol).m_backend.neg;
        local_d8.fpclass = (this->m_pricingViol).m_backend.fpclass;
        local_d8.prec_elem = (this->m_pricingViol).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(&local_d8,pcVar17)
      ;
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
           local_d8.data._M_elems._0_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
           local_d8.data._M_elems._8_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           local_d8.data._M_elems._16_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
           local_d8.data._M_elems._24_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           local_d8.data._M_elems._32_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
           local_d8.data._M_elems._40_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
           local_d8.data._M_elems._48_8_;
      *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
      (__return_storage_ptr__->m_backend).exp = local_d8.exp;
      (__return_storage_ptr__->m_backend).neg = local_d8.neg;
      (__return_storage_ptr__->m_backend).fpclass = local_d8.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = local_d8.prec_elem;
    }
    if (0 < (this->thecovectors->set).thenum) {
      lVar19 = 0;
      lVar15 = 0;
      do {
        pnVar13 = (this->theFvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)&pnVar13->m_backend + lVar19 + 0x48) == 2) ||
            (pnVar18 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)&(pnVar18->m_backend).data + lVar19 + 0x48) == 2)) ||
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)
                                ((long)&pnVar13->m_backend + lVar19),
                                (cpp_dec_float<100U,_int,_void> *)
                                ((long)&(pnVar18->m_backend).data + lVar19)), iVar11 < 1)) {
          pnVar13 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (((*(int *)((long)&pnVar13->m_backend + lVar19 + 0x48) != 2) &&
              (pnVar18 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar18->m_backend).data + lVar19 + 0x48) != 2)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)
                                  ((long)&pnVar13->m_backend + lVar19),
                                  (cpp_dec_float<100U,_int,_void> *)
                                  ((long)&(pnVar18->m_backend).data + lVar19)), iVar11 < 0)) {
            pnVar13 = (this->theLBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar13->m_backend).data + lVar19);
            pcVar16 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)&((this->theFvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar19);
            local_88.fpclass = cpp_dec_float_finite;
            local_88.prec_elem = 0x10;
            local_88.data._M_elems[0] = 0;
            local_88.data._M_elems[1] = 0;
            local_88.data._M_elems[2] = 0;
            local_88.data._M_elems[3] = 0;
            local_88.data._M_elems[4] = 0;
            local_88.data._M_elems[5] = 0;
            local_88.data._M_elems[6] = 0;
            local_88.data._M_elems[7] = 0;
            local_88.data._M_elems[8] = 0;
            local_88.data._M_elems[9] = 0;
            local_88.data._M_elems[10] = 0;
            local_88.data._M_elems[0xb] = 0;
            local_88.data._M_elems[0xc] = 0;
            local_88.data._M_elems[0xd] = 0;
            local_88.data._M_elems._56_5_ = 0;
            local_88.data._M_elems[0xf]._1_3_ = 0;
            local_88.exp = 0;
            local_88.neg = false;
            if (pcVar16 == &local_88) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_88,pcVar17);
              if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
                local_88.neg = (bool)(local_88.neg ^ 1);
              }
            }
            else {
              if (pcVar17 != &local_88) {
                local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
                local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
                local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
                local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 6);
                local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
                local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 10);
                local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
                local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_88.exp = *(int *)((long)&(pnVar13->m_backend).data + lVar19 + 0x40);
                local_88.neg = *(bool *)((long)&(pnVar13->m_backend).data + lVar19 + 0x44);
                local_88._72_8_ = *(undefined8 *)((long)&(pnVar13->m_backend).data + lVar19 + 0x48);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_88,pcVar16);
            }
            if ((((__return_storage_ptr__->m_backend).fpclass == cpp_dec_float_NaN) ||
                (local_88.fpclass == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&__return_storage_ptr__->m_backend,&local_88), iVar11 < 1)) {
              pnVar13 = (this->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar18 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0039dcd6;
            }
            goto LAB_0039dc83;
          }
        }
        else {
          pnVar13 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar13->m_backend + lVar19);
          pcVar16 = (cpp_dec_float<100U,_int,_void> *)
                    ((long)&(((this->theUBbound).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar19);
          local_88.fpclass = cpp_dec_float_finite;
          local_88.prec_elem = 0x10;
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          local_88.data._M_elems[2] = 0;
          local_88.data._M_elems[3] = 0;
          local_88.data._M_elems[4] = 0;
          local_88.data._M_elems[5] = 0;
          local_88.data._M_elems[6] = 0;
          local_88.data._M_elems[7] = 0;
          local_88.data._M_elems[8] = 0;
          local_88.data._M_elems[9] = 0;
          local_88.data._M_elems[10] = 0;
          local_88.data._M_elems[0xb] = 0;
          local_88.data._M_elems[0xc] = 0;
          local_88.data._M_elems[0xd] = 0;
          local_88.data._M_elems._56_5_ = 0;
          local_88.data._M_elems[0xf]._1_3_ = 0;
          local_88.exp = 0;
          local_88.neg = false;
          if (pcVar16 == &local_88) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_88,pcVar17);
            if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
              local_88.neg = (bool)(local_88.neg ^ 1);
            }
          }
          else {
            if (pcVar17 != &local_88) {
              local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
              local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
              local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
              local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 6);
              local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
              local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 10);
              local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
              uVar3 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
              local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
              local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_88.exp = *(int *)((long)&pnVar13->m_backend + lVar19 + 0x40);
              local_88.neg = *(bool *)((long)&pnVar13->m_backend + lVar19 + 0x44);
              local_88._72_8_ = *(undefined8 *)((long)&pnVar13->m_backend + lVar19 + 0x48);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_88,pcVar16);
          }
          if ((((__return_storage_ptr__->m_backend).fpclass == cpp_dec_float_NaN) ||
              (local_88.fpclass == cpp_dec_float_NaN)) ||
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&__return_storage_ptr__->m_backend,&local_88), iVar11 < 1)) {
            pnVar13 = (this->theFvec->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar18 = (this->theUBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_0039dcd6:
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar13->m_backend).data + lVar19);
            pcVar16 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar18->m_backend).data + lVar19);
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            if (pcVar16 == &local_d8) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_d8,pcVar17);
              if (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite) {
                local_d8.neg = (bool)(local_d8.neg ^ 1);
              }
            }
            else {
              if (pcVar17 != &local_d8) {
                local_d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
                local_d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
                local_d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
                local_d8.data._M_elems._24_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 6);
                local_d8.data._M_elems._32_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
                local_d8.data._M_elems._40_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 10);
                local_d8.data._M_elems._48_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
                local_d8.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_d8.exp = *(int *)((long)&(pnVar13->m_backend).data + lVar19 + 0x40);
                local_d8.neg = *(bool *)((long)&(pnVar13->m_backend).data + lVar19 + 0x44);
                local_d8._72_8_ = *(undefined8 *)((long)&(pnVar13->m_backend).data + lVar19 + 0x48);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_d8,pcVar16);
            }
          }
          else {
LAB_0039dc83:
            local_d8.data._M_elems._0_8_ =
                 *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
            local_d8.data._M_elems._8_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
            local_d8.data._M_elems._16_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
            local_d8.data._M_elems._24_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
            local_d8.data._M_elems._32_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
            local_d8.data._M_elems._40_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10);
            local_d8.data._M_elems._48_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc);
            uVar3 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe);
            local_d8.data._M_elems._56_5_ = SUB85(uVar3,0);
            local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_d8.exp = (__return_storage_ptr__->m_backend).exp;
            local_d8.neg = (__return_storage_ptr__->m_backend).neg;
            local_d8.fpclass = (__return_storage_ptr__->m_backend).fpclass;
            local_d8.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
          }
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
               local_d8.data._M_elems._48_8_;
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
               CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
               local_d8.data._M_elems._32_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
               local_d8.data._M_elems._40_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
               local_d8.data._M_elems._16_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
               local_d8.data._M_elems._24_8_;
          *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
               local_d8.data._M_elems._0_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
               local_d8.data._M_elems._8_8_;
          (__return_storage_ptr__->m_backend).exp = local_d8.exp;
          (__return_storage_ptr__->m_backend).neg = local_d8.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_d8.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_d8.prec_elem;
        }
        lVar15 = lVar15 + 1;
        lVar19 = lVar19 + 0x50;
      } while (lVar15 < (this->thecovectors->set).thenum);
    }
  }
  else {
    if (this->m_pricingViolUpToDate != false) {
      uVar3 = *(undefined8 *)(this->m_pricingViol).m_backend.data._M_elems;
      uVar4 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 2);
      uVar5 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 4);
      uVar6 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 6);
      uVar7 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 8);
      uVar8 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 10);
      uVar9 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 0xe);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
           *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 0xc);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) = uVar9;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = uVar7;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) = uVar8;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = uVar5;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar6;
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar3;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar4;
      (__return_storage_ptr__->m_backend).exp = (this->m_pricingViol).m_backend.exp;
      (__return_storage_ptr__->m_backend).neg = (this->m_pricingViol).m_backend.neg;
      iVar10 = (this->m_pricingViol).m_backend.prec_elem;
      (__return_storage_ptr__->m_backend).fpclass = (this->m_pricingViol).m_backend.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = iVar10;
    }
    if (0 < (this->thecovectors->set).thenum) {
      lVar15 = 0;
      lVar19 = 0;
      do {
        pnVar13 = (this->theCoPvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)&pnVar13->m_backend + lVar15 + 0x48) == 2) ||
            (pnVar18 = (this->theCoUbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)&(pnVar18->m_backend).data + lVar15 + 0x48) == 2)) ||
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)
                                ((long)&pnVar13->m_backend + lVar15),
                                (cpp_dec_float<100U,_int,_void> *)
                                ((long)&(pnVar18->m_backend).data + lVar15)), iVar11 < 1)) {
          pnVar13 = (this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (((*(int *)((long)&pnVar13->m_backend + lVar15 + 0x48) != 2) &&
              (pnVar18 = (this->theCoLbound->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar18->m_backend).data + lVar15 + 0x48) != 2)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)
                                  ((long)&pnVar13->m_backend + lVar15),
                                  (cpp_dec_float<100U,_int,_void> *)
                                  ((long)&(pnVar18->m_backend).data + lVar15)), iVar11 < 0)) {
            pnVar13 = (this->theCoLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar13->m_backend).data + lVar15);
            pcVar16 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)&((this->theCoPvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar15);
            local_88.fpclass = cpp_dec_float_finite;
            local_88.prec_elem = 0x10;
            local_88.data._M_elems[0] = 0;
            local_88.data._M_elems[1] = 0;
            local_88.data._M_elems[2] = 0;
            local_88.data._M_elems[3] = 0;
            local_88.data._M_elems[4] = 0;
            local_88.data._M_elems[5] = 0;
            local_88.data._M_elems[6] = 0;
            local_88.data._M_elems[7] = 0;
            local_88.data._M_elems[8] = 0;
            local_88.data._M_elems[9] = 0;
            local_88.data._M_elems[10] = 0;
            local_88.data._M_elems[0xb] = 0;
            local_88.data._M_elems[0xc] = 0;
            local_88.data._M_elems[0xd] = 0;
            local_88.data._M_elems._56_5_ = 0;
            local_88.data._M_elems[0xf]._1_3_ = 0;
            local_88.exp = 0;
            local_88.neg = false;
            if (pcVar16 == &local_88) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_88,pcVar17);
              if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
                local_88.neg = (bool)(local_88.neg ^ 1);
              }
            }
            else {
              if (pcVar17 != &local_88) {
                local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
                local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
                local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
                local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 6);
                local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
                local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 10);
                local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
                local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_88.exp = *(int *)((long)&(pnVar13->m_backend).data + lVar15 + 0x40);
                local_88.neg = *(bool *)((long)&(pnVar13->m_backend).data + lVar15 + 0x44);
                local_88._72_8_ = *(undefined8 *)((long)&(pnVar13->m_backend).data + lVar15 + 0x48);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_88,pcVar16);
            }
            if ((((__return_storage_ptr__->m_backend).fpclass == cpp_dec_float_NaN) ||
                (local_88.fpclass == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&__return_storage_ptr__->m_backend,&local_88), iVar11 < 1)) {
              pUVar14 = this->theCoPvec;
              pUVar12 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)this->theCoLbound;
              goto LAB_0039d432;
            }
            goto LAB_0039d3e6;
          }
        }
        else {
          pnVar13 = (this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar13->m_backend + lVar15);
          pcVar16 = (cpp_dec_float<100U,_int,_void> *)
                    ((long)&(((this->theCoUbound->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar15);
          local_88.fpclass = cpp_dec_float_finite;
          local_88.prec_elem = 0x10;
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          local_88.data._M_elems[2] = 0;
          local_88.data._M_elems[3] = 0;
          local_88.data._M_elems[4] = 0;
          local_88.data._M_elems[5] = 0;
          local_88.data._M_elems[6] = 0;
          local_88.data._M_elems[7] = 0;
          local_88.data._M_elems[8] = 0;
          local_88.data._M_elems[9] = 0;
          local_88.data._M_elems[10] = 0;
          local_88.data._M_elems[0xb] = 0;
          local_88.data._M_elems[0xc] = 0;
          local_88.data._M_elems[0xd] = 0;
          local_88.data._M_elems._56_5_ = 0;
          local_88.data._M_elems[0xf]._1_3_ = 0;
          local_88.exp = 0;
          local_88.neg = false;
          if (pcVar16 == &local_88) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_88,pcVar17);
            if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
              local_88.neg = (bool)(local_88.neg ^ 1);
            }
          }
          else {
            if (pcVar17 != &local_88) {
              local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
              local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
              local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
              local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 6);
              local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
              local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 10);
              local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
              uVar3 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
              local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
              local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_88.exp = *(int *)((long)&pnVar13->m_backend + lVar15 + 0x40);
              local_88.neg = *(bool *)((long)&pnVar13->m_backend + lVar15 + 0x44);
              local_88._72_8_ = *(undefined8 *)((long)&pnVar13->m_backend + lVar15 + 0x48);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_88,pcVar16);
          }
          if ((((__return_storage_ptr__->m_backend).fpclass == cpp_dec_float_NaN) ||
              (local_88.fpclass == cpp_dec_float_NaN)) ||
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&__return_storage_ptr__->m_backend,&local_88), iVar11 < 1)) {
            pUVar12 = this->theCoPvec;
            pUVar14 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this->theCoUbound;
LAB_0039d432:
            pnVar13 = (pUVar12->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar13->m_backend + lVar15);
            pcVar16 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)&(((pUVar14->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar15
                      );
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            if (pcVar16 == &local_d8) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_d8,pcVar17);
              if (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite) {
                local_d8.neg = (bool)(local_d8.neg ^ 1);
              }
            }
            else {
              if (pcVar17 != &local_d8) {
                local_d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
                local_d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
                local_d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
                local_d8.data._M_elems._24_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 6);
                local_d8.data._M_elems._32_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
                local_d8.data._M_elems._40_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 10);
                local_d8.data._M_elems._48_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
                local_d8.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_d8.exp = *(int *)((long)&pnVar13->m_backend + lVar15 + 0x40);
                local_d8.neg = *(bool *)((long)&pnVar13->m_backend + lVar15 + 0x44);
                local_d8._72_8_ = *(undefined8 *)((long)&pnVar13->m_backend + lVar15 + 0x48);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_d8,pcVar16);
            }
          }
          else {
LAB_0039d3e6:
            local_d8.data._M_elems._0_8_ =
                 *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
            local_d8.data._M_elems._8_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
            local_d8.data._M_elems._16_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
            local_d8.data._M_elems._24_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
            local_d8.data._M_elems._32_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
            local_d8.data._M_elems._40_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10);
            local_d8.data._M_elems._48_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc);
            uVar3 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe);
            local_d8.data._M_elems._56_5_ = SUB85(uVar3,0);
            local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_d8.exp = (__return_storage_ptr__->m_backend).exp;
            local_d8.neg = (__return_storage_ptr__->m_backend).neg;
            local_d8.fpclass = (__return_storage_ptr__->m_backend).fpclass;
            local_d8.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
          }
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
               local_d8.data._M_elems._48_8_;
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
               CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
               local_d8.data._M_elems._32_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
               local_d8.data._M_elems._40_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
               local_d8.data._M_elems._16_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
               local_d8.data._M_elems._24_8_;
          *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
               local_d8.data._M_elems._0_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
               local_d8.data._M_elems._8_8_;
          (__return_storage_ptr__->m_backend).exp = local_d8.exp;
          (__return_storage_ptr__->m_backend).neg = local_d8.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_d8.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_d8.prec_elem;
        }
        lVar19 = lVar19 + 1;
        lVar15 = lVar15 + 0x50;
      } while (lVar19 < (this->thecovectors->set).thenum);
    }
    if (0 < (this->thevectors->set).thenum) {
      lVar15 = 0;
      lVar19 = 0;
      do {
        pnVar13 = (this->thePvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)&pnVar13->m_backend + lVar15 + 0x48) == 2) ||
            (pnVar18 = (this->theUbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)&(pnVar18->m_backend).data + lVar15 + 0x48) == 2)) ||
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)
                                ((long)&pnVar13->m_backend + lVar15),
                                (cpp_dec_float<100U,_int,_void> *)
                                ((long)&(pnVar18->m_backend).data + lVar15)), iVar11 < 1)) {
          pnVar13 = (this->thePvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (((*(int *)((long)&pnVar13->m_backend + lVar15 + 0x48) != 2) &&
              (pnVar18 = (this->theLbound->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar18->m_backend).data + lVar15 + 0x48) != 2)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)
                                  ((long)&pnVar13->m_backend + lVar15),
                                  (cpp_dec_float<100U,_int,_void> *)
                                  ((long)&(pnVar18->m_backend).data + lVar15)), iVar11 < 0)) {
            pnVar13 = (this->theLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar13->m_backend).data + lVar15);
            pcVar16 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)&((this->thePvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar15);
            local_88.fpclass = cpp_dec_float_finite;
            local_88.prec_elem = 0x10;
            local_88.data._M_elems[0] = 0;
            local_88.data._M_elems[1] = 0;
            local_88.data._M_elems[2] = 0;
            local_88.data._M_elems[3] = 0;
            local_88.data._M_elems[4] = 0;
            local_88.data._M_elems[5] = 0;
            local_88.data._M_elems[6] = 0;
            local_88.data._M_elems[7] = 0;
            local_88.data._M_elems[8] = 0;
            local_88.data._M_elems[9] = 0;
            local_88.data._M_elems[10] = 0;
            local_88.data._M_elems[0xb] = 0;
            local_88.data._M_elems[0xc] = 0;
            local_88.data._M_elems[0xd] = 0;
            local_88.data._M_elems._56_5_ = 0;
            local_88.data._M_elems[0xf]._1_3_ = 0;
            local_88.exp = 0;
            local_88.neg = false;
            if (pcVar16 == &local_88) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_88,pcVar17);
              if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
                local_88.neg = (bool)(local_88.neg ^ 1);
              }
            }
            else {
              if (pcVar17 != &local_88) {
                local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
                local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
                local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
                local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 6);
                local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
                local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 10);
                local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
                local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_88.exp = *(int *)((long)&(pnVar13->m_backend).data + lVar15 + 0x40);
                local_88.neg = *(bool *)((long)&(pnVar13->m_backend).data + lVar15 + 0x44);
                local_88._72_8_ = *(undefined8 *)((long)&(pnVar13->m_backend).data + lVar15 + 0x48);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_88,pcVar16);
            }
            if ((((__return_storage_ptr__->m_backend).fpclass == cpp_dec_float_NaN) ||
                (local_88.fpclass == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&__return_storage_ptr__->m_backend,&local_88), iVar11 < 1)) {
              pUVar14 = this->thePvec;
              pUVar12 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)this->theLbound;
              goto LAB_0039d80a;
            }
            goto LAB_0039d7be;
          }
        }
        else {
          pnVar13 = (this->thePvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar13->m_backend + lVar15);
          pcVar16 = (cpp_dec_float<100U,_int,_void> *)
                    ((long)&(((this->theUbound->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar15);
          local_88.fpclass = cpp_dec_float_finite;
          local_88.prec_elem = 0x10;
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          local_88.data._M_elems[2] = 0;
          local_88.data._M_elems[3] = 0;
          local_88.data._M_elems[4] = 0;
          local_88.data._M_elems[5] = 0;
          local_88.data._M_elems[6] = 0;
          local_88.data._M_elems[7] = 0;
          local_88.data._M_elems[8] = 0;
          local_88.data._M_elems[9] = 0;
          local_88.data._M_elems[10] = 0;
          local_88.data._M_elems[0xb] = 0;
          local_88.data._M_elems[0xc] = 0;
          local_88.data._M_elems[0xd] = 0;
          local_88.data._M_elems._56_5_ = 0;
          local_88.data._M_elems[0xf]._1_3_ = 0;
          local_88.exp = 0;
          local_88.neg = false;
          if (pcVar16 == &local_88) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_88,pcVar17);
            if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
              local_88.neg = (bool)(local_88.neg ^ 1);
            }
          }
          else {
            if (pcVar17 != &local_88) {
              local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
              local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
              local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
              local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 6);
              local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
              local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 10);
              local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
              uVar3 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
              local_88.data._M_elems._56_5_ = SUB85(uVar3,0);
              local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_88.exp = *(int *)((long)&pnVar13->m_backend + lVar15 + 0x40);
              local_88.neg = *(bool *)((long)&pnVar13->m_backend + lVar15 + 0x44);
              local_88._72_8_ = *(undefined8 *)((long)&pnVar13->m_backend + lVar15 + 0x48);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_88,pcVar16);
          }
          if ((((__return_storage_ptr__->m_backend).fpclass == cpp_dec_float_NaN) ||
              (local_88.fpclass == cpp_dec_float_NaN)) ||
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&__return_storage_ptr__->m_backend,&local_88), iVar11 < 1)) {
            pUVar12 = this->thePvec;
            pUVar14 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this->theUbound;
LAB_0039d80a:
            pnVar13 = (pUVar12->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar13->m_backend + lVar15);
            pcVar16 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)&(((pUVar14->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar15
                      );
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            if (pcVar16 == &local_d8) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_d8,pcVar17);
              if (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite) {
                local_d8.neg = (bool)(local_d8.neg ^ 1);
              }
            }
            else {
              if (pcVar17 != &local_d8) {
                local_d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
                local_d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 2);
                local_d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
                local_d8.data._M_elems._24_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 6);
                local_d8.data._M_elems._32_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
                local_d8.data._M_elems._40_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 10);
                local_d8.data._M_elems._48_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
                local_d8.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_d8.exp = *(int *)((long)&pnVar13->m_backend + lVar15 + 0x40);
                local_d8.neg = *(bool *)((long)&pnVar13->m_backend + lVar15 + 0x44);
                local_d8._72_8_ = *(undefined8 *)((long)&pnVar13->m_backend + lVar15 + 0x48);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_d8,pcVar16);
            }
          }
          else {
LAB_0039d7be:
            local_d8.data._M_elems._0_8_ =
                 *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
            local_d8.data._M_elems._8_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
            local_d8.data._M_elems._16_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
            local_d8.data._M_elems._24_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
            local_d8.data._M_elems._32_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
            local_d8.data._M_elems._40_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10);
            local_d8.data._M_elems._48_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc);
            uVar3 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe);
            local_d8.data._M_elems._56_5_ = SUB85(uVar3,0);
            local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_d8.exp = (__return_storage_ptr__->m_backend).exp;
            local_d8.neg = (__return_storage_ptr__->m_backend).neg;
            local_d8.fpclass = (__return_storage_ptr__->m_backend).fpclass;
            local_d8.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
          }
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
               local_d8.data._M_elems._48_8_;
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
               CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
               local_d8.data._M_elems._32_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
               local_d8.data._M_elems._40_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
               local_d8.data._M_elems._16_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
               local_d8.data._M_elems._24_8_;
          *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
               local_d8.data._M_elems._0_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
               local_d8.data._M_elems._8_8_;
          (__return_storage_ptr__->m_backend).exp = local_d8.exp;
          (__return_storage_ptr__->m_backend).neg = local_d8.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_d8.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_d8.prec_elem;
        }
        lVar19 = lVar19 + 1;
        lVar15 = lVar15 + 0x50;
      } while (lVar19 < (this->thevectors->set).thenum);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::maxInfeas() const
   {
      R inf = 0.0;

      if(type() == ENTER)
      {
         if(m_pricingViolUpToDate && m_pricingViolCoUpToDate)
            inf = m_pricingViol + m_pricingViolCo;

         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] > theUBbound[i])
               inf = SOPLEX_MAX(inf, (*theFvec)[i] - theUBbound[i]);
            else if((*theFvec)[i] < theLBbound[i])
               inf = SOPLEX_MAX(inf, theLBbound[i] - (*theFvec)[i]);
         }
      }
      else
      {
         assert(type() == LEAVE);

         if(m_pricingViolUpToDate)
            inf = m_pricingViol;

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] > (*theCoUbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoPvec)[i] - (*theCoUbound)[i]);
            else if((*theCoPvec)[i] < (*theCoLbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoLbound)[i] - (*theCoPvec)[i]);
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] > (*theUbound)[i])
               inf = SOPLEX_MAX(inf, (*thePvec)[i] - (*theUbound)[i]);
            else if((*thePvec)[i] < (*theLbound)[i])
               inf = SOPLEX_MAX(inf, (*theLbound)[i] - (*thePvec)[i]);
         }
      }

      return inf;
   }